

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNHeap::AddSmallHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  bool bVar2;
  bool bVar3;
  idx_t sel_count;
  idx_t r;
  ulong uVar4;
  anon_union_16_2_67f50693_for_value *data;
  string_t *sort_key;
  anon_struct_16_3_d7536bce_for_pointer aVar5;
  TopNEntry entry;
  
  sort_key = (string_t *)sort_keys_vec->data;
  bVar3 = false;
  for (uVar4 = 0; uVar4 < input->count; uVar4 = uVar4 + 1) {
    bVar2 = EntryShouldBeAdded(this,sort_key);
    if (bVar2) {
      entry.sort_key.value._0_8_ = *(undefined8 *)&sort_key->value;
      entry.sort_key.value.pointer.ptr = (sort_key->value).pointer.ptr;
      entry.index = uVar4 + 0xffffffff;
      AddEntryToHeap(this,&entry);
      bVar3 = true;
    }
    sort_key = sort_key + 1;
  }
  if (bVar3) {
    paVar1 = (anon_union_16_2_67f50693_for_value *)
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sel_count = 0;
    for (data = (anon_union_16_2_67f50693_for_value *)
                (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                super__Vector_impl_data._M_start; data != paVar1;
        data = (anon_union_16_2_67f50693_for_value *)((long)data + 0x18)) {
      uVar4 = *(ulong *)(data + 1);
      if (0xfffffffe < uVar4) {
        if (0xc < (((string_t *)&(data->pointer).length)->value).pointer.length) {
          aVar5 = (anon_struct_16_3_d7536bce_for_pointer)
                  StringHeap::AddBlob(&this->sort_key_heap,(string_t *)&data->pointer);
          data->pointer = aVar5;
          uVar4 = *(ulong *)(data + 1);
        }
        (this->matching_sel).sel_vector[sel_count] = (int)uVar4 + 1;
        *(idx_t *)(data + 1) = (this->heap_data).count + sel_count;
        sel_count = sel_count + 1;
      }
    }
    DataChunk::Append(&this->heap_data,input,true,&this->matching_sel,sel_count);
  }
  return;
}

Assistant:

void TopNHeap::AddSmallHeap(DataChunk &input, Vector &sort_keys_vec) {
	// insert the sort keys into the priority queue
	constexpr idx_t BASE_INDEX = NumericLimits<uint32_t>::Maximum();

	bool any_added = false;
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key;
		entry.index = BASE_INDEX + r;
		AddEntryToHeap(entry);
		any_added = true;
	}
	if (!any_added) {
		// early-out: no matches
		return;
	}

	// for all matching entries we need to copy over the corresponding payload values
	idx_t match_count = 0;
	for (auto &entry : heap) {
		if (entry.index < BASE_INDEX) {
			continue;
		}
		// this entry was added in this chunk
		// if not inlined - copy over the string to the string heap
		if (!entry.sort_key.IsInlined()) {
			entry.sort_key = sort_key_heap.AddBlob(entry.sort_key);
		}
		// to finalize the addition of this entry we need to move over the payload data
		matching_sel.set_index(match_count, entry.index - BASE_INDEX);
		entry.index = heap_data.size() + match_count;
		match_count++;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}